

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtAlignedObjectArray<double>_>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtAlignedObjectArray<double>_> *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->m_size;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      cbtAlignedObjectArray<double>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<double> *)(&this->m_data->field_0x0 + lVar2));
      lVar2 = lVar2 + 0x20;
    } while ((long)iVar1 * 0x20 != lVar2);
  }
  if (this->m_data != (cbtAlignedObjectArray<double> *)0x0) {
    if (this->m_ownsMemory == true) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_data = (cbtAlignedObjectArray<double> *)0x0;
  }
  this->m_ownsMemory = true;
  this->m_data = (cbtAlignedObjectArray<double> *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}